

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

Array * __thiscall tf::TaskQueue<tf::Node_*>::Array::resize(Array *this,int64_t b,int64_t t)

{
  Array *this_00;
  Node *o;
  long local_40;
  int64_t i;
  Array *ptr;
  int64_t t_local;
  int64_t b_local;
  Array *this_local;
  
  this_00 = (Array *)operator_new(0x18);
  Array(this_00,this->C * 2);
  for (local_40 = t; local_40 != b; local_40 = local_40 + 1) {
    o = pop(this,local_40);
    push(this_00,local_40,o);
  }
  return this_00;
}

Assistant:

Array* resize(int64_t b, int64_t t) {
      Array* ptr = new Array {2*C};
      for(int64_t i=t; i!=b; ++i) {
        ptr->push(i, pop(i));
      }
      return ptr;
    }